

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apinames.cpp
# Opt level: O3

int test_c(void)

{
  long *plVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  RtMidiApi RVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  ulong __n;
  ulong uVar9;
  ulong uVar10;
  string name;
  string displayName;
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> apis;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  allocator<char> local_69;
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> local_48;
  
  uVar3 = rtmidi_get_compiled_api(0,0);
  __n = (ulong)uVar3;
  std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::vector
            (&local_48,__n,(allocator_type *)&local_90);
  rtmidi_get_compiled_api
            (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
             super__Vector_impl_data._M_start,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"API names by identifier (C):\n",0x1d);
  if (__n != 0) {
    uVar9 = 0;
    do {
      pcVar6 = (char *)rtmidi_api_name(local_48.
                                       super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar9]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar6,(allocator<char> *)&local_68);
      if (local_88 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid name for API ",0x15);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9]);
        std::operator<<(poVar7,"\n");
        goto LAB_00102e3d;
      }
      pcVar6 = (char *)rtmidi_api_display_name
                                 (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar9]);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar6,&local_69);
      if (local_60 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid display name for API ",0x1d);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9]);
        std::operator<<(poVar7,"\n");
        goto LAB_00102e3d;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar9]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," \'",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_90,local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\': \'",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      uVar9 = uVar9 + 1;
    } while (__n != uVar9);
  }
  pcVar6 = (char *)rtmidi_api_name(0xffffffff);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "";
  }
  local_90 = local_80;
  sVar8 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar6,pcVar6 + sVar8);
  if (local_88 == 0) {
    pcVar6 = (char *)rtmidi_api_display_name(0xffffffff);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    local_68 = local_58;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar6,pcVar6 + sVar8);
    iVar4 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar4 == 0) {
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"API identifiers by name (C):\n",0x1d);
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          pcVar6 = (char *)rtmidi_api_name(local_48.
                                           super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar9]);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "";
          }
          local_90 = local_80;
          sVar8 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar6,pcVar6 + sVar8)
          ;
          RVar5 = rtmidi_compiled_api_by_name(local_90);
          if (RVar5 != local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Bad identifier for API \'",0x18);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_90,local_88);
            std::operator<<(poVar7,"\'\n");
            goto LAB_00102e3d;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* \'",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_90,local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\': ",3);
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,local_48.
                                     super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar9]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if (local_88 != 0) {
            uVar10 = 0;
            do {
              plVar1 = local_90;
              if ((uVar10 & 1) == 0) {
                iVar4 = tolower((int)*(char *)((long)local_90 + uVar10));
                uVar2 = (undefined1)iVar4;
              }
              else {
                iVar4 = toupper((int)*(char *)((long)local_90 + uVar10));
                uVar2 = (undefined1)iVar4;
              }
              *(undefined1 *)((long)plVar1 + uVar10) = uVar2;
              uVar10 = uVar10 + 1;
            } while (uVar10 < local_88);
          }
          iVar4 = rtmidi_compiled_api_by_name(local_90);
          if (iVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Identifier ",0xb);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," for invalid API \'",0x12);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_90,local_88);
            std::operator<<(poVar7,"\'\n");
            goto LAB_00102e3d;
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != __n);
      }
      iVar4 = rtmidi_compiled_api_by_name("");
      if (iVar4 == 0) {
        if (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return 0;
      }
      std::operator<<((ostream *)&std::cout,"Bad identifier for unknown API name\n");
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Bad display string for invalid API \'",0x24);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_68,local_60);
      std::operator<<(poVar7,"\'\n");
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Bad string for invalid API \'",0x1c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::operator<<(poVar7,"\'\n");
  }
LAB_00102e3d:
  exit(1);
}

Assistant:

int test_c() {
    unsigned api_count = rtmidi_get_compiled_api(NULL, 0);
    std::vector<RtMidiApi> apis(api_count);
    rtmidi_get_compiled_api(apis.data(), api_count);

    // ensure the known APIs return valid names
    std::cout << "API names by identifier (C):\n";
    for ( size_t i = 0; i < api_count; ++i) {
        const std::string name = rtmidi_api_name(apis[i]);
        if (name.empty()) {
            std::cout << "Invalid name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        const std::string displayName = rtmidi_api_display_name(apis[i]);
        if (displayName.empty()) {
            std::cout << "Invalid display name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        std::cout << "* " << (int)apis[i] << " '" << name << "': '" << displayName << "'\n";
    }

    // ensure unknown APIs return the empty string
    {
        const char *s = rtmidi_api_name((RtMidiApi)-1);
        const std::string name(s?s:"");
        if (!name.empty()) {
            std::cout << "Bad string for invalid API '" << name << "'\n";
            exit(1);
        }
        s = rtmidi_api_display_name((RtMidiApi)-1);
        const std::string displayName(s?s:"");
        if (displayName!="Unknown") {
            std::cout << "Bad display string for invalid API '" << displayName << "'\n";
            exit(1);
        }
    }

    // try getting API identifier by name
    std::cout << "API identifiers by name (C):\n";
    for ( size_t i = 0; i < api_count ; ++i ) {
        const char *s = rtmidi_api_name(apis[i]);
        std::string name(s?s:"");
        if ( rtmidi_compiled_api_by_name(name.c_str()) != apis[i] ) {
            std::cout << "Bad identifier for API '" << name << "'\n";
            exit( 1 );
        }
        std::cout << "* '" << name << "': " << (int)apis[i] << "\n";

        for ( size_t j = 0; j < name.size(); ++j )
            name[j] = (j & 1) ? toupper(name[j]) : tolower(name[j]);
        RtMidiApi api = rtmidi_compiled_api_by_name(name.c_str());
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Identifier " << (int)api << " for invalid API '" << name << "'\n";
            exit( 1 );
        }
    }

    // try getting an API identifier by unknown name
    {
        RtMidiApi api;
        api = rtmidi_compiled_api_by_name("");
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Bad identifier for unknown API name\n";
            exit( 1 );
        }
    }

    return 0;
}